

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  undefined8 uVar1;
  bool bVar2;
  xml_encoding xVar3;
  xml_parse_result *extraout_RAX;
  undefined4 extraout_var;
  xml_parse_result *extraout_RAX_00;
  size_t sVar4;
  xml_parse_result *extraout_RAX_01;
  xml_node_struct *pxVar5;
  long lVar6;
  xml_attribute_struct *pxVar7;
  char_t *pcVar8;
  xml_node_struct **ppxVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  char *__function;
  ulong uVar15;
  byte *pbVar16;
  uint uVar17;
  int iVar18;
  ushort *puVar19;
  ushort *puVar20;
  long lVar21;
  ulong uVar22;
  xml_parse_result *pxVar23;
  ushort uVar24;
  xml_allocator *alloc;
  long lVar25;
  byte bVar26;
  size_t __n;
  xml_parse_result *pxVar27;
  byte *pbVar28;
  byte *pbVar29;
  byte *pbVar30;
  byte *pbVar31;
  size_t length;
  char_t *buffer;
  xml_parse_result result;
  xml_parse_result *local_b0;
  byte *local_a8;
  xml_node_struct *local_a0;
  byte *local_98;
  xml_parse_result *pxStack_90;
  xml_encoding local_88;
  undefined4 uStack_84;
  xml_parse_result *local_78;
  xml_node_struct *local_70;
  uint local_64;
  xml_node_struct *local_60;
  undefined8 local_58;
  xml_node_struct **local_50;
  code *local_48;
  code *local_40;
  byte *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return extraout_RAX;
  }
  local_70 = root;
  xVar3 = get_buffer_encoding(encoding,contents,size);
  local_58 = CONCAT44(extraout_var,xVar3);
  local_a8 = (byte *)0x0;
  local_b0 = (xml_parse_result *)0x0;
  if (xVar3 == encoding_utf8) goto LAB_0011dda6;
  if ((xVar3 & ~encoding_utf8) == encoding_utf16_le) {
    uVar22 = size >> 1;
    lVar6 = 0;
    if (xVar3 == encoding_utf16_le) {
      uVar15 = uVar22;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar12 = *puVar19;
          if (uVar12 < 0xd800) {
            lVar21 = 3 - (ulong)(uVar12 < 0x800);
            if (uVar12 < 0x80) {
              lVar21 = 1;
            }
            lVar6 = lVar6 + lVar21;
LAB_0011df39:
            puVar20 = puVar19 + 1;
            lVar21 = -1;
          }
          else {
            if ((~uVar12 & 0xe000) == 0) {
              lVar6 = lVar6 + 3;
              goto LAB_0011df39;
            }
            puVar20 = puVar19 + 1;
            lVar21 = -1;
            if (((uVar15 != 1) && ((uVar12 & 0xfc00) == 0xd800)) && ((*puVar20 & 0xfc00) == 0xdc00))
            {
              lVar6 = lVar6 + 4;
              puVar20 = puVar19 + 2;
              lVar21 = -2;
            }
          }
          uVar15 = uVar15 + lVar21;
          puVar19 = puVar20;
        } while (uVar15 != 0);
      }
      pxVar27 = (xml_parse_result *)(lVar6 + 1);
      pbVar30 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pxVar27);
      if (pbVar30 == (byte *)0x0) goto LAB_0011ddc7;
      pbVar29 = pbVar30;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar12 = *puVar19;
          uVar17 = (uint)uVar12;
          if ((uVar12 < 0xd800) || ((~uVar12 & 0xe000) == 0)) {
            pbVar29 = utf8_writer::low(pbVar29,uVar17);
            puVar20 = puVar19 + 1;
            lVar21 = -1;
          }
          else {
            puVar20 = puVar19 + 1;
            lVar21 = -1;
            if ((uVar22 != 1) && ((uVar17 & 0xfc00) == 0xd800)) {
              uVar12 = *puVar20;
              if ((uVar12 & 0xfc00) == 0xdc00) {
                uVar13 = (uVar17 << 10 & 0xffc00) + 0x10000;
                *pbVar29 = (byte)(uVar13 >> 0x12) | 0xf0;
                pbVar29[1] = (byte)(uVar13 >> 0xc) & 0x3f | 0x80;
                pbVar29[2] = (byte)((uVar12 & 0x3c0 | uVar17 << 10) >> 6) & 0x3f | 0x80;
                pbVar29[3] = (byte)uVar12 & 0x3f | 0x80;
                pbVar29 = pbVar29 + 4;
                puVar20 = puVar19 + 2;
                lVar21 = -2;
              }
            }
          }
          uVar22 = uVar22 + lVar21;
          puVar19 = puVar20;
        } while (uVar22 != 0);
      }
      if (pbVar29 != pbVar30 + lVar6) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
LAB_0011f613:
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x88e,__function);
      }
    }
    else {
      uVar15 = uVar22;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar12 = *puVar19 << 8;
          uVar24 = uVar12 | *puVar19 >> 8;
          if (uVar24 < 0xd800) {
            lVar21 = 3 - (ulong)(uVar24 < 0x800);
            if (uVar24 < 0x80) {
              lVar21 = 1;
            }
            lVar6 = lVar6 + lVar21;
LAB_0011dffb:
            puVar20 = puVar19 + 1;
            lVar21 = -1;
          }
          else {
            if ((~uVar24 & 0xe000) == 0) {
              lVar6 = lVar6 + 3;
              goto LAB_0011dffb;
            }
            puVar20 = puVar19 + 1;
            lVar21 = -1;
            if (((uVar15 != 1) && ((uVar12 & 0xfc00) == 0xd800)) && ((*puVar20 & 0xfc) == 0xdc)) {
              lVar6 = lVar6 + 4;
              puVar20 = puVar19 + 2;
              lVar21 = -2;
            }
          }
          uVar15 = uVar15 + lVar21;
          puVar19 = puVar20;
        } while (uVar15 != 0);
      }
      pxVar27 = (xml_parse_result *)(lVar6 + 1);
      pbVar30 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pxVar27);
      if (pbVar30 == (byte *)0x0) goto LAB_0011ddc7;
      pbVar29 = pbVar30;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar12 = *puVar19 << 8 | *puVar19 >> 8;
          uVar17 = (uint)uVar12;
          if ((uVar12 < 0xd800) || ((~uVar12 & 0xe000) == 0)) {
            pbVar29 = utf8_writer::low(pbVar29,uVar17);
            puVar20 = puVar19 + 1;
            lVar21 = -1;
          }
          else {
            puVar20 = puVar19 + 1;
            lVar21 = -1;
            if ((uVar22 != 1) && ((uVar17 & 0xfc00) == 0xd800)) {
              uVar12 = *puVar20;
              uVar13 = (uint)(ushort)(uVar12 << 8 | uVar12 >> 8);
              if ((uVar13 & 0xfc00) == 0xdc00) {
                uVar14 = (uVar17 << 10 & 0xffc00) + 0x10000;
                *pbVar29 = (byte)(uVar14 >> 0x12) | 0xf0;
                pbVar29[1] = (byte)(uVar14 >> 0xc) & 0x3f | 0x80;
                pbVar29[2] = (byte)((uVar13 & 0x3c0 | uVar17 << 10) >> 6) & 0x3f | 0x80;
                pbVar29[3] = (byte)(uVar12 >> 8) & 0x3f | 0x80;
                pbVar29 = pbVar29 + 4;
                puVar20 = puVar19 + 2;
                lVar21 = -2;
              }
            }
          }
          uVar22 = uVar22 + lVar21;
          puVar19 = puVar20;
        } while (uVar22 != 0);
      }
      if (pbVar29 != pbVar30 + lVar6) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_0011f613;
      }
    }
    *pbVar29 = 0;
    local_b0 = pxVar27;
    local_a8 = pbVar30;
  }
  else if (xVar3 - encoding_utf32_le < 2) {
    uVar22 = size >> 2;
    if (xVar3 == encoding_utf32_le) {
      if (size < 4) {
        lVar6 = 0;
      }
      else {
        uVar15 = 0;
        lVar6 = 0;
        do {
          uVar17 = *(uint *)((long)contents + uVar15 * 4);
          if (uVar17 < 0x10000) {
            lVar21 = 3 - (ulong)(uVar17 < 0x800);
            if (uVar17 < 0x80) {
              lVar21 = 1;
            }
            lVar6 = lVar6 + lVar21;
          }
          else {
            lVar6 = lVar6 + 4;
          }
          uVar15 = uVar15 + 1;
        } while (uVar22 != uVar15);
      }
      pxVar27 = (xml_parse_result *)(lVar6 + 1);
      pbVar30 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pxVar27);
      if (pbVar30 == (byte *)0x0) goto LAB_0011ddc7;
      pbVar29 = pbVar30;
      if (3 < size) {
        uVar15 = 0;
        do {
          uVar17 = *(uint *)((long)contents + uVar15 * 4);
          if (uVar17 < 0x10000) {
            pbVar29 = utf8_writer::low(pbVar29,uVar17);
          }
          else {
            *pbVar29 = (byte)(uVar17 >> 0x12) | 0xf0;
            pbVar29[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
            pbVar29[2] = (byte)(uVar17 >> 6) & 0x3f | 0x80;
            pbVar29[3] = (byte)uVar17 & 0x3f | 0x80;
            pbVar29 = pbVar29 + 4;
          }
          uVar15 = uVar15 + 1;
        } while (uVar22 != uVar15);
      }
      if (pbVar29 != pbVar30 + lVar6) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
        goto LAB_0011f613;
      }
    }
    else {
      if (size < 4) {
        lVar6 = 0;
      }
      else {
        uVar15 = 0;
        lVar6 = 0;
        do {
          uVar17 = *(uint *)((long)contents + uVar15 * 4);
          uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                   uVar17 << 0x18;
          if (uVar17 < 0x10000) {
            lVar21 = 3 - (ulong)(uVar17 < 0x800);
            if (uVar17 < 0x80) {
              lVar21 = 1;
            }
            lVar6 = lVar6 + lVar21;
          }
          else {
            lVar6 = lVar6 + 4;
          }
          uVar15 = uVar15 + 1;
        } while (uVar22 != uVar15);
      }
      pxVar27 = (xml_parse_result *)(lVar6 + 1);
      pbVar30 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pxVar27);
      if (pbVar30 == (byte *)0x0) goto LAB_0011ddc7;
      pbVar29 = pbVar30;
      if (3 < size) {
        uVar15 = 0;
        do {
          uVar17 = *(uint *)((long)contents + uVar15 * 4);
          uVar13 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                   uVar17 << 0x18;
          if (uVar13 < 0x10000) {
            pbVar29 = utf8_writer::low(pbVar29,uVar13);
          }
          else {
            *pbVar29 = (byte)(uVar13 >> 0x12) | 0xf0;
            pbVar29[1] = (byte)(uVar13 >> 0xc) & 0x3f | 0x80;
            pbVar29[2] = (byte)(uVar13 >> 6) & 0x3f | 0x80;
            pbVar29[3] = (byte)(uVar17 >> 0x18) & 0x3f | 0x80;
            pbVar29 = pbVar29 + 4;
          }
          uVar15 = uVar15 + 1;
        } while (uVar22 != uVar15);
      }
      if (pbVar29 != pbVar30 + lVar6) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_0011f613;
      }
    }
    *pbVar29 = 0;
    local_b0 = pxVar27;
    local_a8 = pbVar30;
  }
  else {
    if (xVar3 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x8e3,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    __n = 0;
    if (size == 0) {
LAB_0011e065:
      if (size != __n) {
        if (size == __n) {
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          sVar4 = __n;
          do {
            lVar6 = (lVar6 - (ulong)(-1 < *(char *)((long)contents + sVar4))) + 2;
            sVar4 = sVar4 + 1;
          } while (size != sVar4);
        }
        lVar21 = lVar6 + __n;
        pbVar30 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        if (pbVar30 == (byte *)0x0) goto LAB_0011ddc7;
        lVar6 = lVar6 + __n;
        memcpy(pbVar30,contents,__n);
        pbVar29 = pbVar30 + __n;
        for (; size != __n; __n = __n + 1) {
          pbVar29 = utf8_writer::low(pbVar29,(uint)*(byte *)((long)contents + __n));
        }
        if (pbVar29 != pbVar30 + lVar6) {
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x8bc,
                        "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                       );
        }
        *pbVar29 = 0;
        local_b0 = (xml_parse_result *)(lVar21 + 1);
        local_a8 = pbVar30;
        goto LAB_0011e481;
      }
    }
    else {
      do {
        if (*(char *)((long)contents + __n) < '\0') {
          if (size < __n) {
            __assert_fail("prefix_length <= data_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                          ,0x8a7,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          goto LAB_0011e065;
        }
        __n = __n + 1;
      } while (size != __n);
    }
LAB_0011dda6:
    bVar2 = get_mutable_buffer((char_t **)&local_a8,(size_t *)&local_b0,contents,size,is_mutable);
    if (!bVar2) {
LAB_0011ddc7:
      xml_parse_result::xml_parse_result(__return_storage_ptr__);
      __return_storage_ptr__->status = status_out_of_memory;
      __return_storage_ptr__->offset = 0;
      return extraout_RAX_00;
    }
  }
LAB_0011e481:
  pxVar5 = local_70;
  pbVar30 = local_a8;
  if (own) {
    if (contents != (void *)0x0 && local_a8 != (byte *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_0011e4d1:
    *out_buffer = (char_t *)pbVar30;
  }
  else if (local_a8 != (byte *)contents) goto LAB_0011e4d1;
  pxVar27 = local_b0;
  doc->buffer = (char_t *)pbVar30;
  if (local_b0 != (xml_parse_result *)0x0) {
    if (pxVar5->first_child == (xml_node_struct *)0x0) {
      local_60 = (xml_node_struct *)0x0;
    }
    else {
      local_60 = pxVar5->first_child->prev_sibling_c;
    }
    endch = (pbVar30 + -1)[(long)local_b0];
    (pbVar30 + -1)[(long)local_b0] = 0;
    pbVar29 = pbVar30;
    if ((*pbVar30 == 0xef) && (pbVar30[1] == 0xbb)) {
      pbVar29 = pbVar30 + (ulong)(pbVar30[2] == 0xbf) * 3;
    }
    local_38 = pbVar30;
    local_50 = &pxVar5->first_child;
    alloc = &doc->super_xml_allocator;
    local_78 = (xml_parse_result *)&local_b0[-1].field_0x17;
    local_40 = *(code **)((long)&PTR_parse_simple_00145cc8 + (ulong)(options >> 1 & 0x78));
    local_48 = (code *)(&PTR_parse_00145d48)[options >> 9 & 4 | options >> 4 & 3];
    local_64 = options & 0x22;
    bVar26 = endch ^ 0x3e;
LAB_0011e607:
    do {
      uVar22 = (ulong)*pbVar29;
      while( true ) {
        pbVar30 = pbVar29;
        if ((char)uVar22 == '\0') goto LAB_0011f293;
        if ((int)uVar22 == 0x3c) goto LAB_0011e693;
        bVar10 = (anonymous_namespace)::chartype_table[uVar22];
        pbVar29 = pbVar30;
        while ((bVar10 & 8) != 0) {
          uVar22 = (ulong)pbVar29[1];
          pbVar29 = pbVar29 + 1;
          bVar10 = (anonymous_namespace)::chartype_table[uVar22];
        }
        if (((char)uVar22 != '<') && (uVar22 != 0)) break;
        if (pbVar30 == pbVar29) {
          __assert_fail("mark != s",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0xd63,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
           (((options >> 10 & 1) == 0 ||
            ((((char)uVar22 == '<' && (pbVar29[1] == 0x2f)) &&
             (pxVar5->first_child == (xml_node_struct *)0x0)))))) break;
      }
      if ((options >> 0xb & 1) != 0) {
        pbVar30 = pbVar29;
      }
      if (((options >> 0xc & 1) != 0) || (pxVar5->parent != (xml_node_struct *)0x0)) {
        if ((((options >> 0xd & 1) == 0) ||
            ((pxVar5->parent == (xml_node_struct *)0x0 ||
             (pxVar5->first_child != (xml_node_struct *)0x0)))) || (pxVar5->value != (char_t *)0x0))
        {
          pxVar5 = append_new_node(pxVar5,alloc,node_pcdata);
          pbVar31 = pbVar30;
          if (pxVar5 != (xml_node_struct *)0x0) {
            pxVar5->value = (char_t *)pbVar30;
            pxVar5 = pxVar5->parent;
            goto LAB_0011e6d7;
          }
LAB_0011f303:
          iVar18 = 3;
        }
        else {
          pxVar5->value = (char_t *)pbVar30;
LAB_0011e6d7:
          pbVar30 = (byte *)(*local_48)(pbVar30);
          bVar10 = *pbVar30;
          if (bVar10 != 0) goto LAB_0011e700;
LAB_0011f293:
          pbVar31 = (byte *)0x0;
          if (pxVar5 != local_70) {
            pbVar31 = pbVar30;
          }
          iVar18 = 0xe;
          if (pxVar5 == local_70) {
            iVar18 = 0;
          }
        }
        goto LAB_0011f411;
      }
      while( true ) {
        if (*pbVar30 == 0) goto LAB_0011f293;
        if (*pbVar30 == 0x3c) break;
        pbVar30 = pbVar30 + 1;
      }
LAB_0011e693:
      bVar10 = pbVar30[1];
      pbVar30 = pbVar30 + 1;
LAB_0011e700:
      pbVar31 = pbVar30;
      if ((char)(anonymous_namespace)::chartype_table[bVar10] < '\0') {
        pxVar5 = append_new_node(pxVar5,alloc,node_element);
        if (pxVar5 == (xml_node_struct *)0x0) goto LAB_0011f303;
        pxVar5->name = (char_t *)pbVar30;
        pbVar30 = pbVar30 + 1;
        do {
          pbVar31 = pbVar30;
          uVar22 = (ulong)pbVar31[-1];
          bVar10 = (anonymous_namespace)::chartype_table[uVar22];
          if ((bVar10 & 0x40) == 0) {
            pbVar31 = pbVar31 + -1;
            goto LAB_0011ead4;
          }
          uVar22 = (ulong)*pbVar31;
          bVar10 = (anonymous_namespace)::chartype_table[uVar22];
          if ((bVar10 & 0x40) == 0) goto LAB_0011ead4;
          uVar22 = (ulong)pbVar31[1];
          bVar10 = (anonymous_namespace)::chartype_table[uVar22];
          if ((bVar10 & 0x40) == 0) {
            pbVar31 = pbVar31 + 1;
            goto LAB_0011ead4;
          }
          uVar22 = (ulong)pbVar31[2];
          bVar10 = (anonymous_namespace)::chartype_table[uVar22];
          pbVar30 = pbVar31 + 4;
        } while ((bVar10 & 0x40) != 0);
        pbVar31 = pbVar31 + 2;
LAB_0011ead4:
        *pbVar31 = 0;
        pbVar29 = pbVar31 + 1;
        if ((char)uVar22 != '>') {
          if ((bVar10 & 8) != 0) goto LAB_0011eed3;
          iVar18 = 0xb;
          if ((char)uVar22 == '\0') {
            pbVar29 = pbVar31;
            if (endch != 0x3e) goto LAB_0011f411;
          }
          else {
            pbVar31 = pbVar29;
            if ((int)uVar22 != 0x2f) goto LAB_0011f411;
            bVar10 = *pbVar29;
            if ((bVar10 != 0x3e) && (bVar26 != 0 || bVar10 != 0)) goto LAB_0011f411;
            pxVar5 = pxVar5->parent;
            pbVar29 = pbVar29 + (bVar10 == 0x3e);
          }
        }
        goto LAB_0011e607;
      }
      if (bVar10 == 0x21) {
        bVar10 = pbVar30[1];
        local_a0 = pxVar5;
        if (bVar10 == 0x5b) {
          if (pbVar30[2] == 0x43) {
            if (pbVar30[3] != 0x44) {
              pbVar31 = pbVar30 + 3;
              goto LAB_0011f406;
            }
            if (pbVar30[4] != 0x41) {
              pbVar31 = pbVar30 + 4;
              goto LAB_0011f406;
            }
            if (pbVar30[5] != 0x54) {
              pbVar31 = pbVar30 + 5;
              goto LAB_0011f406;
            }
            if (pbVar30[6] != 0x41) {
              pbVar31 = pbVar30 + 6;
              goto LAB_0011f406;
            }
            if (pbVar30[7] != 0x5b) {
              pbVar31 = pbVar30 + 7;
              goto LAB_0011f406;
            }
            pbVar31 = pbVar30 + 8;
            if ((options & 4) == 0) {
              do {
                if (*pbVar31 == 0x5d) {
                  if (pbVar31[1] == 0x5d) {
                    if ((pbVar31[2] == 0x3e) || (bVar26 == 0 && pbVar31[2] == 0)) goto LAB_0011f1a2;
                  }
                }
                else if (*pbVar31 == 0) goto LAB_0011f406;
                pbVar31 = pbVar31 + 1;
              } while( true );
            }
            pxVar5 = append_new_node(pxVar5,alloc,node_cdata);
            if (pxVar5 == (xml_node_struct *)0x0) goto LAB_0011f3ec;
            pxVar5->value = (char_t *)pbVar31;
            if ((options & 0x20) == 0) {
              do {
                if (*pbVar31 == 0x5d) {
                  if (pbVar31[1] == 0x5d) {
                    if ((pbVar31[2] == 0x3e) || (bVar26 == 0 && pbVar31[2] == 0)) goto LAB_0011f19e;
                  }
                }
                else if (*pbVar31 == 0) {
                  iVar18 = 8;
                  goto LAB_0011f411;
                }
                pbVar31 = pbVar31 + 1;
              } while( true );
            }
            pbVar31 = (byte *)strconv_cdata((char_t *)pbVar31,endch);
            if (pbVar31 != (byte *)0x0) goto LAB_0011f1a5;
            iVar18 = 8;
            pbVar31 = (byte *)pxVar5->value;
          }
          else {
            pbVar31 = pbVar30 + 2;
LAB_0011f406:
            iVar18 = 8;
          }
        }
        else {
          pbVar29 = pbVar30 + 1;
          pbVar31 = pbVar29;
          if (bVar10 == 0x44) {
            iVar18 = 5;
            if ((((pbVar30[2] == 0x4f) && (pbVar30[3] == 0x43)) && (pbVar30[4] == 0x54)) &&
               ((pbVar30[5] == 0x59 && (pbVar30[6] == 0x50)))) {
              if ((pbVar30[7] == 0x45) || (endch == 0x45 && pbVar30[7] == 0)) {
                iVar18 = 9;
                pbVar31 = pbVar30 + -1;
                if (pxVar5->parent == (xml_node_struct *)0x0) {
                  bVar10 = pbVar30[-1];
                  if ((bVar10 != 0x3c) && (bVar10 != 0)) {
                    __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                                  ,0xbb5,
                                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                 );
                  }
                  bVar10 = 0x44;
                  lVar6 = 0;
LAB_0011ec2f:
                  pbVar31 = pbVar29;
                  if (bVar10 < 0x3c) {
                    if ((bVar10 != 0x22) && (bVar10 != 0x27)) {
                      if (bVar10 == 0) goto LAB_0011f1eb;
LAB_0011ed0d:
                      pbVar29 = pbVar29 + 1;
                      goto LAB_0011ed10;
                    }
                    pbVar29 = pbVar29 + 1;
                    do {
                      pbVar31 = pbVar29;
                      bVar11 = *pbVar31;
                      pbVar29 = pbVar31 + 1;
                      if (bVar11 == 0) break;
                    } while (bVar11 != bVar10);
                    if (bVar11 == 0) goto LAB_0011f411;
                  }
                  else {
                    if (bVar10 != 0x3c) {
                      if (bVar10 == 0x3e) {
                        if (lVar6 != 0) {
                          lVar6 = lVar6 + -1;
                          goto LAB_0011ed0d;
                        }
                        *pbVar29 = 0;
                        pbVar29 = pbVar29 + 1;
                        goto LAB_0011f208;
                      }
                      goto LAB_0011ed0d;
                    }
                    if (pbVar29[1] == 0x3f) {
                      pbVar31 = pbVar29 + 2;
                      do {
                        if (*pbVar31 == 0x3f) {
                          if (pbVar31[1] == 0x3e) goto LAB_0011ed3c;
                        }
                        else if (*pbVar31 == 0) goto LAB_0011f411;
                        pbVar31 = pbVar31 + 1;
                      } while( true );
                    }
                    if (pbVar29[1] != 0x21) goto LAB_0011f411;
                    if (pbVar29[2] == 0x2d) {
                      if (pbVar29[3] == 0x2d) {
                        pbVar31 = pbVar29 + 4;
                        do {
                          if (*pbVar31 == 0x2d) {
                            if ((pbVar31[1] == 0x2d) && (pbVar31[2] == 0x3e)) goto LAB_0011ed80;
                          }
                          else if (*pbVar31 == 0) break;
                          pbVar31 = pbVar31 + 1;
                        } while( true );
                      }
                      goto LAB_0011f411;
                    }
                    if (pbVar29[2] == 0x5b) {
                      pbVar29 = pbVar29 + 3;
                      lVar21 = 0;
LAB_0011ecb7:
                      pbVar29 = pbVar29 + 3;
                      do {
                        bVar10 = pbVar29[-3];
                        if (bVar10 == 0x3c) {
                          if ((pbVar29[-2] == 0x21) && (pbVar29[-1] == 0x5b)) {
                            lVar21 = lVar21 + 1;
                            goto LAB_0011ecb7;
                          }
                        }
                        else if (bVar10 == 0x5d) {
                          if ((pbVar29[-2] == 0x5d) && (pbVar29[-1] == 0x3e)) goto LAB_0011ecf6;
                        }
                        else if (bVar10 == 0) {
                          pbVar31 = pbVar29 + -3;
                          goto LAB_0011f411;
                        }
                        pbVar29 = pbVar29 + 1;
                      } while( true );
                    }
                    pbVar29 = pbVar29 + 2;
                    lVar6 = lVar6 + 1;
                  }
                  goto LAB_0011ed10;
                }
              }
            }
          }
          else if (bVar10 == 0x2d) {
            if (pbVar30[2] == 0x2d) {
              pbVar31 = pbVar30 + 3;
              if ((options & 2) == 0) {
LAB_0011e942:
                if (local_64 != 0x22) {
                  do {
                    if (*pbVar31 == 0x2d) {
                      if (pbVar31[1] == 0x2d) {
                        bVar10 = pbVar31[2];
                        if ((bVar10 == 0x3e) || (bVar26 == 0 && bVar10 == 0)) goto LAB_0011f11c;
                      }
                    }
                    else if (*pbVar31 == 0) goto LAB_0011f3ca;
                    pbVar31 = pbVar31 + 1;
                  } while( true );
                }
                local_98 = (byte *)0x0;
                pxStack_90 = (xml_parse_result *)0x0;
LAB_0011e955:
                do {
                  pbVar29 = pbVar31;
                  pxVar23 = pxStack_90;
                  bVar10 = *pbVar29;
                  if (((anonymous_namespace)::chartype_table[bVar10] & 0x20) == 0) {
                    pbVar30 = pbVar29 + 2;
                    do {
                      pbVar29 = pbVar30;
                      bVar10 = pbVar29[-1];
                      if (((anonymous_namespace)::chartype_table[bVar10] & 0x20) != 0) {
                        pbVar29 = pbVar29 + -1;
                        goto LAB_0011e9a8;
                      }
                      bVar10 = *pbVar29;
                      if (((anonymous_namespace)::chartype_table[bVar10] & 0x20) != 0)
                      goto LAB_0011e9a8;
                      bVar10 = pbVar29[1];
                      if (((anonymous_namespace)::chartype_table[bVar10] & 0x20) != 0) {
                        pbVar29 = pbVar29 + 1;
                        goto LAB_0011e9a8;
                      }
                      bVar10 = pbVar29[2];
                      pbVar30 = pbVar29 + 4;
                    } while (((anonymous_namespace)::chartype_table[bVar10] & 0x20) == 0);
                    pbVar29 = pbVar29 + 2;
                  }
LAB_0011e9a8:
                  if (bVar10 != 0xd) {
                    if (bVar10 == 0x2d) {
                      if ((pbVar29[1] == 0x2d) &&
                         ((pbVar29[2] == 0x3e || (bVar26 == 0 && pbVar29[2] == 0))))
                      goto LAB_0011f13a;
                    }
                    else if (bVar10 == 0) {
                      iVar18 = 7;
                      pbVar31 = (byte *)pxVar5->value;
                      goto LAB_0011f411;
                    }
                    pbVar31 = pbVar29 + 1;
                    goto LAB_0011e955;
                  }
                  pbVar31 = pbVar29 + 1;
                  *pbVar29 = 10;
                  if (pbVar29[1] == 10) {
                    if (local_98 != (byte *)0x0) {
                      if (pbVar31 < local_98) {
                        __assert_fail("s >= end",
                                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                                      ,0x974,
                                      "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                     );
                      }
                      memmove(local_98 + -(long)pxStack_90,local_98,(long)pbVar31 - (long)local_98);
                    }
                    local_98 = pbVar29 + 2;
                    pxStack_90 = (xml_parse_result *)((long)pxVar23 + 1);
                    pbVar31 = local_98;
                  }
                } while( true );
              }
              pxVar5 = append_new_node(pxVar5,alloc,node_comment);
              if (pxVar5 != (xml_node_struct *)0x0) {
                pxVar5->value = (char_t *)pbVar31;
                goto LAB_0011e942;
              }
LAB_0011f3ec:
              iVar18 = 3;
            }
            else {
              pbVar31 = pbVar30 + 2;
LAB_0011f3ca:
              iVar18 = 7;
            }
          }
          else if ((endch != 0x2d) || (iVar18 = 7, bVar10 != 0)) {
            iVar18 = (uint)(endch == 0x5b && bVar10 == 0) * 3 + 5;
          }
        }
        goto LAB_0011f411;
      }
      if (bVar10 == 0x3f) {
        iVar18 = 6;
        pbVar31 = pbVar30 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar30[1]]) goto LAB_0011f411;
        lVar21 = 4;
        pbVar31 = pbVar30 + 3;
        lVar6 = 1;
        pbVar28 = pbVar30 + 1;
        do {
          pbVar29 = pbVar28;
          lVar25 = lVar6;
          pbVar16 = pbVar31;
          uVar22 = (ulong)*pbVar29;
          pbVar28 = pbVar29 + 1;
          lVar21 = lVar21 + -1;
          pbVar31 = pbVar16 + 1;
          lVar6 = lVar25 + 1;
        } while (((anonymous_namespace)::chartype_table[uVar22] & 0x40) != 0);
        pbVar31 = pbVar29;
        if (*pbVar29 == 0) goto LAB_0011f411;
        pbVar31 = pbVar30 + lVar25;
        if (((pbVar30[1] & 0xdf) == 0x58) && ((pbVar30[2] & 0xdf) == 0x4d)) {
          bVar2 = (pbVar30[3] & 0xdf) != 0x4c;
          uVar17 = 1;
          if (lVar21 == 0 && !bVar2) {
            uVar17 = 0x100;
          }
          if ((options & uVar17) == 0) {
LAB_0011ea63:
            do {
              if ((char)uVar22 == '?') {
                bVar10 = pbVar29[1];
                if ((bVar10 == 0x3e) || (bVar26 == 0 && bVar10 == 0)) goto LAB_0011ee9a;
              }
              else {
                pbVar31 = pbVar29;
                if ((int)uVar22 == 0) goto LAB_0011f411;
                bVar10 = pbVar29[1];
              }
              uVar22 = (ulong)bVar10;
              pbVar29 = pbVar29 + 1;
            } while( true );
          }
          if (lVar21 != 0 || bVar2) goto LAB_0011eb34;
          if (pxVar5->parent != (xml_node_struct *)0x0) goto LAB_0011f411;
          pxVar5 = append_new_node(pxVar5,alloc,node_declaration);
          if (pxVar5 == (xml_node_struct *)0x0) goto LAB_0011f36f;
          bVar2 = true;
        }
        else {
          if ((options & 1) == 0) goto LAB_0011ea63;
LAB_0011eb34:
          pxVar5 = append_new_node(pxVar5,alloc,node_pi);
          if (pxVar5 == (xml_node_struct *)0x0) {
LAB_0011f36f:
            iVar18 = 3;
            goto LAB_0011f411;
          }
          bVar2 = false;
        }
        pxVar5->name = (char_t *)(pbVar30 + 1);
        bVar10 = *pbVar29;
        *pbVar29 = 0;
        if ((ulong)bVar10 == 0x3f) {
          bVar10 = *pbVar28;
          if ((bVar10 == 0x3e) || (bVar26 == 0 && bVar10 == 0)) {
            pbVar29 = pbVar28 + (bVar10 == 0x3e);
            pxVar5 = pxVar5->parent;
            goto LAB_0011eeb6;
          }
          pbVar31 = pbVar31 + 1;
        }
        else {
          pbVar31 = pbVar28;
          if (((anonymous_namespace)::chartype_table[bVar10] & 8) != 0) {
            do {
              pbVar30 = pbVar16;
              uVar22 = (ulong)pbVar29[1];
              pbVar29 = pbVar29 + 1;
              pbVar16 = pbVar30 + 1;
            } while (((anonymous_namespace)::chartype_table[uVar22] & 8) != 0);
            do {
              if ((char)uVar22 == '?') {
                bVar10 = *pbVar30;
                if ((bVar10 == 0x3e) || (bVar26 == 0 && bVar10 == 0)) goto LAB_0011f0db;
              }
              else {
                if ((int)uVar22 == 0) {
                  pbVar31 = pbVar30 + -1;
                  break;
                }
                bVar10 = *pbVar30;
              }
              uVar22 = (ulong)bVar10;
              pbVar30 = pbVar30 + 1;
            } while( true );
          }
        }
        goto LAB_0011f411;
      }
      if (bVar10 != 0x2f) {
        iVar18 = (endch == 0x3f && bVar10 == 0) + 5;
        goto LAB_0011f411;
      }
      pbVar31 = pbVar30 + 1;
      pbVar30 = (byte *)pxVar5->name;
      iVar18 = 0xe;
      pbVar28 = pbVar31;
      if (pbVar30 == (byte *)0x0) goto LAB_0011f411;
      while (bVar10 = *pbVar28, ((anonymous_namespace)::chartype_table[bVar10] & 0x40) != 0) {
        bVar11 = *pbVar30;
        pbVar30 = pbVar30 + 1;
        pbVar28 = pbVar28 + 1;
        if (bVar10 != bVar11) goto LAB_0011f411;
      }
      if (*pbVar30 != 0) {
        if (((bVar10 == 0) && (*pbVar30 == endch)) && (pbVar30[1] == 0)) {
LAB_0011f517:
          iVar18 = 0xd;
          pbVar31 = pbVar28;
        }
        goto LAB_0011f411;
      }
      pbVar30 = pbVar28;
      do {
        pbVar28 = pbVar30;
        bVar10 = *pbVar28;
        pbVar30 = pbVar28 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar10] & 8) != 0);
      if (bVar10 == 0) goto LAB_0011ee74;
      pxVar5 = pxVar5->parent;
      pbVar29 = pbVar28 + 1;
      if (bVar10 != 0x3e) goto LAB_0011f517;
    } while( true );
  }
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
  __return_storage_ptr__->offset = 0;
  xVar3 = (xml_encoding)local_58;
  pxStack_90 = extraout_RAX_01;
LAB_0011f4fe:
  __return_storage_ptr__->encoding = xVar3;
  return pxStack_90;
LAB_0011f19e:
  *pbVar31 = 0;
LAB_0011f1a2:
  pbVar31 = pbVar31 + 1;
LAB_0011f1a5:
  pbVar29 = pbVar31 + (ulong)(pbVar31[1] == 0x3e) + 1;
  pxVar5 = local_a0;
  goto LAB_0011e607;
LAB_0011ed3c:
  pbVar29 = pbVar31 + 2;
  goto LAB_0011ed10;
LAB_0011ed80:
  pbVar29 = pbVar31 + 3;
LAB_0011ed10:
  bVar10 = *pbVar29;
  goto LAB_0011ec2f;
LAB_0011ecf6:
  if (lVar21 != 0) {
    lVar21 = lVar21 + -1;
    goto LAB_0011ecb7;
  }
  goto LAB_0011ed10;
LAB_0011f1eb:
  if ((endch != 0x3e) || (lVar6 != 0)) goto LAB_0011f411;
LAB_0011f208:
  if ((options >> 9 & 1) != 0) {
    pbVar30 = pbVar30 + 7;
    do {
      pbVar31 = pbVar30 + 1;
      pbVar30 = pbVar30 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar31] & 8) != 0);
    pxVar5 = append_new_node(pxVar5,alloc,node_doctype);
    if (pxVar5 == (xml_node_struct *)0x0) {
      iVar18 = 3;
      pbVar31 = pbVar29;
      goto LAB_0011f411;
    }
    pxVar5->value = (char_t *)pbVar30;
    pxVar5 = local_a0;
  }
  goto LAB_0011e607;
LAB_0011f11c:
  if ((options & 2) != 0) {
    *pbVar31 = 0;
  }
  pxVar5 = local_a0;
  pbVar29 = pbVar31 + (ulong)(bVar10 == 0x3e) + 2;
  goto LAB_0011e607;
LAB_0011f13a:
  pcVar8 = gap::flush((gap *)&local_98,(char_t *)pbVar29);
  *pcVar8 = '\0';
  pbVar29 = pbVar29 + (ulong)(pbVar29[2] == 0x3e) + 2;
  pxVar5 = local_a0;
  goto LAB_0011e607;
LAB_0011ee9a:
  pbVar29 = pbVar29 + (ulong)(bVar10 == 0x3e) + 1;
  goto LAB_0011eeb6;
LAB_0011f0db:
  if (bVar2) {
    pbVar30[-1] = 0x2f;
    goto LAB_0011eebf;
  }
  pxVar5->value = (char_t *)pbVar29;
  pxVar5 = pxVar5->parent;
  pbVar30[-1] = 0;
  pbVar29 = pbVar30 + (*pbVar30 == 0x3e);
LAB_0011eeb6:
  if (pxVar5 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
LAB_0011eebf:
  if ((pxVar5->header & 0xf) == 7) {
LAB_0011eed3:
    while( true ) {
      do {
        pbVar31 = pbVar29;
        bVar10 = *pbVar31;
        pbVar29 = pbVar31 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar10] & 8) != 0);
      if (-1 < (char)(anonymous_namespace)::chartype_table[bVar10]) break;
      pxVar7 = append_new_attribute(pxVar5,alloc);
      if (pxVar7 == (xml_attribute_struct *)0x0) {
        iVar18 = 3;
        goto LAB_0011f411;
      }
      pxVar7->name = (char_t *)pbVar31;
      pbVar30 = pbVar31 + 1;
      do {
        pbVar31 = pbVar30;
        bVar10 = pbVar31[-1];
        bVar11 = (anonymous_namespace)::chartype_table[bVar10];
        if ((bVar11 & 0x40) == 0) {
          pbVar31 = pbVar31 + -1;
          goto LAB_0011ef51;
        }
        bVar10 = *pbVar31;
        bVar11 = (anonymous_namespace)::chartype_table[bVar10];
        if ((bVar11 & 0x40) == 0) goto LAB_0011ef51;
        bVar10 = pbVar31[1];
        bVar11 = (anonymous_namespace)::chartype_table[bVar10];
        if ((bVar11 & 0x40) == 0) {
          pbVar31 = pbVar31 + 1;
          goto LAB_0011ef51;
        }
        bVar10 = pbVar31[2];
        bVar11 = (anonymous_namespace)::chartype_table[bVar10];
        pbVar30 = pbVar31 + 4;
      } while ((bVar11 & 0x40) != 0);
      pbVar31 = pbVar31 + 2;
LAB_0011ef51:
      *pbVar31 = 0;
      while (pbVar31 = pbVar31 + 1, (bVar11 & 8) != 0) {
        bVar10 = *pbVar31;
        bVar11 = (anonymous_namespace)::chartype_table[bVar10];
      }
      if (bVar10 != 0x3d) {
        iVar18 = 0xc;
        goto LAB_0011f411;
      }
      do {
        pbVar30 = pbVar31;
        bVar10 = *pbVar30;
        pbVar29 = pbVar30 + 1;
        pbVar31 = pbVar29;
      } while (((anonymous_namespace)::chartype_table[bVar10] & 8) != 0);
      iVar18 = 0xc;
      if ((bVar10 != 0x22) && (pbVar31 = pbVar30, bVar10 != 0x27)) goto LAB_0011f411;
      pxVar7->value = (char_t *)pbVar29;
      pbVar31 = (byte *)(*local_40)(pbVar29,(int)(char)bVar10);
      if (pbVar31 == (byte *)0x0) {
        pbVar31 = (byte *)pxVar7->value;
        goto LAB_0011f411;
      }
      pbVar29 = pbVar31;
      if ((char)(anonymous_namespace)::chartype_table[*pbVar31] < '\0') goto LAB_0011f411;
    }
    if (bVar10 != 0x3e) {
      if (bVar10 == 0x2f) {
        if (*pbVar29 == 0x3e) {
          pxVar5 = pxVar5->parent;
          pbVar29 = pbVar31 + 2;
        }
        else {
          iVar18 = 0xb;
          pbVar31 = pbVar29;
          if ((endch != 0x3e) || (*pbVar29 != 0)) goto LAB_0011f411;
          pxVar5 = pxVar5->parent;
        }
      }
      else {
        iVar18 = 0xb;
        if ((endch != 0x3e) || (pbVar29 = pbVar31, bVar10 != 0)) goto LAB_0011f411;
      }
    }
  }
  goto LAB_0011e607;
LAB_0011ee74:
  pxVar5 = pxVar5->parent;
  pbVar29 = pbVar28;
  if (endch != 0x3e) goto LAB_0011f52f;
  goto LAB_0011e607;
LAB_0011f52f:
  iVar18 = 0xd;
  pbVar31 = pbVar28;
LAB_0011f411:
  pxVar23 = (xml_parse_result *)(pbVar31 + -(long)local_38);
  if (pbVar31 == (byte *)0x0) {
    pxVar23 = (xml_parse_result *)0x0;
  }
  xml_parse_result::xml_parse_result((xml_parse_result *)&local_98);
  uVar1 = local_58;
  local_98 = (byte *)CONCAT44(local_98._4_4_,iVar18);
  pxStack_90 = pxVar23;
  if (((long)pxVar23 < 0) || (pxVar27 < pxVar23)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (iVar18 == 0) {
    if (endch == 0x3c) {
      xml_parse_result::xml_parse_result(__return_storage_ptr__);
      __return_storage_ptr__->status = status_unrecognized_tag;
      pxStack_90 = local_78;
    }
    else {
      if ((options >> 0xc & 1) != 0) goto LAB_0011f4c8;
      ppxVar9 = &local_60->next_sibling;
      if (local_60 == (xml_node_struct *)0x0) {
        ppxVar9 = local_50;
      }
      for (pxVar5 = *ppxVar9; pxVar5 != (xml_node_struct *)0x0; pxVar5 = pxVar5->next_sibling) {
        if ((pxVar5->header & 0xf) == 2) goto LAB_0011f4c8;
      }
      xml_parse_result::xml_parse_result(__return_storage_ptr__);
      __return_storage_ptr__->status = status_no_document_element;
      pxStack_90 = local_78;
    }
  }
  else {
    if (((pxVar23 != (xml_parse_result *)0x0) && (pxVar23 == local_78)) && (endch == 0)) {
      pxStack_90 = (xml_parse_result *)&pxVar27[-1].field_0x16;
    }
LAB_0011f4c8:
    __return_storage_ptr__->encoding = local_88;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uStack_84;
    *(byte **)__return_storage_ptr__ = local_98;
  }
  xVar3 = (xml_encoding)uVar1;
  __return_storage_ptr__->offset = (ptrdiff_t)pxStack_90;
  goto LAB_0011f4fe;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}